

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_28c34e::SndioPlayback::stop(SndioPlayback *this)

{
  __int_type_conflict _Var1;
  int iVar2;
  
  LOCK();
  _Var1 = (this->mKillNow)._M_base._M_i;
  (this->mKillNow)._M_base._M_i = true;
  UNLOCK();
  if (((_Var1 & 1U) == 0) && ((this->mThread)._M_id._M_thread != 0)) {
    std::thread::join();
    iVar2 = sio_stop(this->mSndHandle);
    if ((iVar2 == 0) && (0 < (int)gLogLevel)) {
      _GLOBAL__N_1::SndioPlayback::stop();
    }
  }
  return;
}

Assistant:

void SndioPlayback::stop()
{
    if(mKillNow.exchange(true, std::memory_order_acq_rel) || !mThread.joinable())
        return;
    mThread.join();

    if(!sio_stop(mSndHandle))
        ERR("Error stopping device\n");
}